

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShapeFEA.cpp
# Opt level: O1

ChColor __thiscall chrono::ChVisualShapeFEA::ComputeFalseColor(ChVisualShapeFEA *this,double mv)

{
  long in_RSI;
  ChColor CVar2;
  ulong uVar1;
  
  CVar2 = ChColor::ComputeFalseColor
                    (mv,*(double *)(in_RSI + 0x18),*(double *)(in_RSI + 0x20),SUB81(this,0));
  uVar1 = CVar2._0_8_;
  if ((*(int *)(in_RSI + 0x10) == 1) && ((ChVisualShapeFEA *)(in_RSI + 0x5c) != this)) {
    *(undefined4 *)
     &(this->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(undefined4 *)(in_RSI + 0x5c);
    *(undefined4 *)
     ((long)&(this->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr + 4) = *(undefined4 *)(in_RSI + 0x60);
    uVar1 = (ulong)*(uint *)(in_RSI + 100);
    *(uint *)&(this->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = *(uint *)(in_RSI + 100);
  }
  CVar2.R = (float)(int)uVar1;
  CVar2.G = (float)(int)(uVar1 >> 0x20);
  return CVar2;
}

Assistant:

ChColor ChVisualShapeFEA::ComputeFalseColor(double mv) {
    ChColor c = ChColor::ComputeFalseColor(mv, colorscale_min, colorscale_max, true);

    if (fem_data_type == DataType::SURFACE)
        c = meshcolor;

    return c;
}